

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O0

int __thiscall ncnn::PriorBox::load_param(PriorBox *this,ParamDict *pd)

{
  int iVar1;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar2;
  Mat *in_stack_fffffffffffffe30;
  Mat *this_00;
  Mat *in_stack_fffffffffffffe38;
  Mat *this_01;
  Mat *this_02;
  Mat local_1a0 [2];
  Mat local_120 [2];
  Mat local_90 [2];
  Mat *local_10;
  
  this_02 = local_90;
  local_10 = in_RSI;
  Mat::Mat(this_02);
  iVar1 = (int)((ulong)in_RSI >> 0x20);
  ParamDict::get((ParamDict *)this_02,iVar1,in_RDI);
  Mat::operator=(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  Mat::~Mat((Mat *)0x1871c3);
  Mat::~Mat((Mat *)0x1871d0);
  this_01 = local_10;
  Mat::Mat(local_120);
  ParamDict::get((ParamDict *)this_02,iVar1,in_RDI);
  Mat::operator=(this_01,in_stack_fffffffffffffe30);
  Mat::~Mat((Mat *)0x187235);
  Mat::~Mat((Mat *)0x187242);
  this_00 = local_1a0;
  Mat::Mat(this_00);
  ParamDict::get((ParamDict *)this_02,iVar1,in_RDI);
  Mat::operator=(this_01,this_00);
  Mat::~Mat((Mat *)0x187299);
  Mat::~Mat((Mat *)0x1872a3);
  fVar2 = ParamDict::get((ParamDict *)local_10,3,0.1);
  *(float *)&in_RDI[5].data = fVar2;
  fVar2 = ParamDict::get((ParamDict *)local_10,4,0.1);
  *(float *)((long)&in_RDI[5].data + 4) = fVar2;
  fVar2 = ParamDict::get((ParamDict *)local_10,5,0.2);
  *(float *)&in_RDI[5].refcount = fVar2;
  fVar2 = ParamDict::get((ParamDict *)local_10,6,0.2);
  *(float *)((long)&in_RDI[5].refcount + 4) = fVar2;
  iVar1 = ParamDict::get((ParamDict *)local_10,7,1);
  *(int *)&in_RDI[5].elemsize = iVar1;
  iVar1 = ParamDict::get((ParamDict *)local_10,8,0);
  *(int *)((long)&in_RDI[5].elemsize + 4) = iVar1;
  iVar1 = ParamDict::get((ParamDict *)local_10,9,0);
  in_RDI[5].packing = iVar1;
  iVar1 = ParamDict::get((ParamDict *)local_10,10,0);
  *(int *)&in_RDI[5].field_0x1c = iVar1;
  fVar2 = ParamDict::get((ParamDict *)local_10,0xb,-233.0);
  *(float *)&in_RDI[5].allocator = fVar2;
  fVar2 = ParamDict::get((ParamDict *)local_10,0xc,-233.0);
  *(float *)((long)&in_RDI[5].allocator + 4) = fVar2;
  fVar2 = ParamDict::get((ParamDict *)local_10,0xd,0.0);
  in_RDI[5].dims = (int)fVar2;
  return 0;
}

Assistant:

int PriorBox::load_param(const ParamDict& pd)
{
    min_sizes = pd.get(0, Mat());
    max_sizes = pd.get(1, Mat());
    aspect_ratios = pd.get(2, Mat());
    variances[0] = pd.get(3, 0.1f);
    variances[1] = pd.get(4, 0.1f);
    variances[2] = pd.get(5, 0.2f);
    variances[3] = pd.get(6, 0.2f);
    flip = pd.get(7, 1);
    clip = pd.get(8, 0);
    image_width = pd.get(9, 0);
    image_height = pd.get(10, 0);
    step_width = pd.get(11, -233.f);
    step_height = pd.get(12, -233.f);
    offset = pd.get(13, 0.f);

    return 0;
}